

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O2

void ZXing::DataMatrix::C40Encoder::WriteNextTriplet(EncoderContext *context,string *buffer)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  int iVar4;
  
  pcVar3 = (char *)std::__cxx11::string::at((ulong)buffer);
  cVar1 = *pcVar3;
  pcVar3 = (char *)std::__cxx11::string::at((ulong)buffer);
  cVar2 = *pcVar3;
  pcVar3 = (char *)std::__cxx11::string::at((ulong)buffer);
  iVar4 = (int)*pcVar3 + cVar2 * 0x28 + cVar1 * 0x640 + 1;
  EncoderContext::addCodeword(context,(uint8_t)(iVar4 / 0x100));
  EncoderContext::addCodeword(context,(uint8_t)iVar4);
  std::__cxx11::string::erase((ulong)buffer,0);
  return;
}

Assistant:

static void WriteNextTriplet(EncoderContext& context, std::string& buffer)
	{
		EncodeToCodewords(context, buffer, 0);
		buffer.erase(0, 3);
	}